

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O3

URL * __thiscall
miniros::master::AddressResolver::resolveAddressFor
          (URL *__return_storage_ptr__,AddressResolver *this,
          shared_ptr<miniros::master::NodeRef> *node,shared_ptr<miniros::master::NodeRef> *requester
          )

{
  _Atomic_word *p_Var1;
  int iVar2;
  NodeRef *this_00;
  NetAdapter *pNVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  long *plVar6;
  _Base_ptr p_Var7;
  NetAdapter *this_01;
  pthread_mutex_t *__mutex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *host;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _Base_ptr p_Var9;
  bool bVar10;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [16];
  _Base_ptr local_68 [2];
  _Base_ptr local_58 [2];
  _Base_ptr local_48;
  _Base_ptr local_40;
  pthread_mutex_t *local_38;
  
  this_00 = (node->super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this_00 == (NodeRef *)0x0) {
    network::URL::URL(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  NodeRef::getUrl(__return_storage_ptr__,this_00);
  if ((requester->super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == (element_type *)0x0) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (resolveAddressFor::loc.initialized_ == false) {
      local_68[0] = (_Base_ptr)local_58;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"miniros.unknown_package","");
      plVar6 = (long *)::std::__cxx11::string::append((char *)local_68);
      p_Var9 = (_Base_ptr)(plVar6 + 2);
      if ((_Base_ptr)*plVar6 == p_Var9) {
        local_78._0_8_ = *(undefined8 *)p_Var9;
        local_78._8_8_ = plVar6[3];
        local_88._M_allocated_capacity = (size_type)(_Base_ptr)local_78;
      }
      else {
        local_78._0_8_ = *(undefined8 *)p_Var9;
        local_88._M_allocated_capacity = (size_type)(_Base_ptr)*plVar6;
      }
      local_88._8_8_ = plVar6[1];
      *plVar6 = (long)p_Var9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)::std::__cxx11::string::append(local_88._M_local_buf);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar8) {
        local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_98._8_8_ = plVar6[3];
        local_a8._0_8_ = &local_98;
      }
      else {
        local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar6;
      }
      local_a8._8_8_ = plVar6[1];
      *plVar6 = (long)paVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      console::initializeLogLocation(&resolveAddressFor::loc,(string *)local_a8,Warn);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ != &local_98) {
        operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
      }
      if ((_Base_ptr)local_88._M_allocated_capacity != (_Base_ptr)local_78) {
        operator_delete((void *)local_88._M_allocated_capacity,local_78._0_8_ + 1);
      }
      if (local_68[0] != (_Base_ptr)local_58) {
        operator_delete(local_68[0],(ulong)((long)&local_58[0]->_M_color + 1));
      }
    }
    if (resolveAddressFor::loc.level_ != Warn) {
      console::setLogLocationLevel(&resolveAddressFor::loc,Warn);
      console::checkLogLocationEnabled(&resolveAddressFor::loc);
    }
    if (resolveAddressFor::loc.logger_enabled_ != true) {
      return __return_storage_ptr__;
    }
    console::print((FilterBase *)0x0,resolveAddressFor::loc.logger_,resolveAddressFor::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                   ,0xbe,
                   "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                   ,"resolveAddressFor(%s) - requester is null",
                   (((node->super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->m_id)._M_dataplus._M_p);
    return __return_storage_ptr__;
  }
  __mutex = (pthread_mutex_t *)&this->m_mutex;
  iVar4 = pthread_mutex_lock(__mutex);
  if (iVar4 != 0) {
    ::std::__throw_system_error(iVar4);
  }
  if (this->m_resolveIp == false) goto LAB_0023e64a;
  local_38 = __mutex;
  NodeRef::hostInfo((NodeRef *)local_a8);
  if ((_Base_ptr)local_a8._8_8_ == (_Base_ptr)0x0) {
    p_Var9 = (_Base_ptr)0x0;
  }
  else {
    iVar4 = *(int *)(local_a8._8_8_ + 8);
    do {
      if (iVar4 == 0) {
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
        p_Var9 = (_Base_ptr)0x0;
        goto LAB_0023e2e7;
      }
      LOCK();
      iVar2 = *(int *)(local_a8._8_8_ + 8);
      bVar10 = iVar4 == iVar2;
      if (bVar10) {
        *(int *)(local_a8._8_8_ + 8) = iVar4 + 1;
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      UNLOCK();
    } while (!bVar10);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_a8._0_8_;
    p_Var9 = (_Base_ptr)local_a8._8_8_;
    if (*(int *)(local_a8._8_8_ + 8) == 0) {
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
    }
LAB_0023e2e7:
    local_40 = (_Base_ptr)node;
    if ((_Base_ptr)local_a8._8_8_ != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)(local_a8._8_8_ + 8) + 4);
        iVar4 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar4 = *(_Atomic_word *)((long)(local_a8._8_8_ + 8) + 4);
        *(int *)((long)(local_a8._8_8_ + 8) + 4) = iVar4 + -1;
      }
      if (iVar4 == 1) {
        (**(code **)(*(long *)local_a8._8_8_ + 0x18))();
      }
    }
    node = (shared_ptr<miniros::master::NodeRef> *)local_40;
    if (paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
      NodeRef::hostInfo((NodeRef *)local_a8);
      if ((_Base_ptr)local_a8._8_8_ == (_Base_ptr)0x0) {
        local_48 = (_Base_ptr)0x0;
LAB_0023e456:
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
            ::loc.initialized_ == false) {
          local_68[0] = (_Base_ptr)local_58;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_68,"miniros.unknown_package","");
          plVar6 = (long *)::std::__cxx11::string::append((char *)local_68);
          p_Var7 = (_Base_ptr)(plVar6 + 2);
          if ((_Base_ptr)*plVar6 == p_Var7) {
            local_78._0_8_ = *(undefined8 *)p_Var7;
            local_78._8_8_ = plVar6[3];
            local_88._M_allocated_capacity = (size_type)(_Base_ptr)local_78;
          }
          else {
            local_78._0_8_ = *(undefined8 *)p_Var7;
            local_88._M_allocated_capacity = (size_type)(_Base_ptr)*plVar6;
          }
          local_88._8_8_ = plVar6[1];
          *plVar6 = (long)p_Var7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)::std::__cxx11::string::append(local_88._M_local_buf);
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar8) {
            local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_98._8_8_ = plVar6[3];
            local_a8._0_8_ = &local_98;
          }
          else {
            local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar6;
          }
          local_a8._8_8_ = plVar6[1];
          *plVar6 = (long)paVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          console::initializeLogLocation
                    (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                      ::loc,(string *)local_a8,Warn);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._0_8_ != &local_98) {
            operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
          }
          if ((_Base_ptr)local_88._M_allocated_capacity != (_Base_ptr)local_78) {
            operator_delete((void *)local_88._M_allocated_capacity,local_78._0_8_ + 1);
          }
          if (local_68[0] != (_Base_ptr)local_58) {
            operator_delete(local_68[0],(ulong)((long)&local_58[0]->_M_color + 1));
          }
        }
        if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
            ::loc.level_ != Warn) {
          console::setLogLocationLevel
                    (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                      ::loc,Warn);
          console::checkLogLocationEnabled
                    (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                      ::loc);
        }
        if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
            ::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,
                         resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                         ::loc.logger_,
                         resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                         ::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                         ,0xce,
                         "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                         ,"resolveAddressFor(%s) - no HostInfo for requester %s",
                         *(undefined8 *)(*(long *)local_40 + 0xc0),
                         (((requester->
                           super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr)->m_id)._M_dataplus._M_p);
        }
      }
      else {
        local_48 = (_Base_ptr)local_a8._8_8_;
        iVar4 = *(int *)(local_a8._8_8_ + 8);
        do {
          if (iVar4 == 0) {
            local_48 = (_Base_ptr)0x0;
            host = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
            goto LAB_0023e3d5;
          }
          LOCK();
          iVar2 = *(int *)(local_a8._8_8_ + 8);
          bVar10 = iVar4 == iVar2;
          if (bVar10) {
            *(int *)(local_a8._8_8_ + 8) = iVar4 + 1;
            iVar2 = iVar4;
          }
          iVar4 = iVar2;
          UNLOCK();
        } while (!bVar10);
        host = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a8._0_8_;
        if (*(int *)(local_a8._8_8_ + 8) == 0) {
          host = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
        }
LAB_0023e3d5:
        if ((_Base_ptr)local_a8._8_8_ != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = (_Atomic_word *)((long)(local_a8._8_8_ + 8) + 4);
            iVar4 = *p_Var1;
            *p_Var1 = *p_Var1 + -1;
            UNLOCK();
          }
          else {
            iVar4 = *(_Atomic_word *)((long)(local_a8._8_8_ + 8) + 4);
            *(int *)((long)(local_a8._8_8_ + 8) + 4) = iVar4 + -1;
          }
          if (iVar4 == 1) {
            (**(code **)(*(long *)local_a8._8_8_ + 0x18))();
          }
        }
        if (host == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) goto LAB_0023e456;
        if (paVar8 != host) {
          if (paVar8->_M_local_buf[0x50] == '\x01') {
            pNVar3 = (this->m_adapters).
                     super__Vector_base<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (this_01 = (this->m_adapters).
                           super__Vector_base<miniros::master::NetAdapter,_std::allocator<miniros::master::NetAdapter>_>
                           ._M_impl.super__Vector_impl_data._M_start; this_01 != pNVar3;
                this_01 = this_01 + 1) {
              bVar10 = NetAdapter::hasAccessTo(this_01,(HostInfo *)host);
              if (bVar10) {
                network::NetAddress::str_abi_cxx11_((string *)local_a8,&this_01->address);
LAB_0023e684:
                ::std::__cxx11::string::operator=
                          ((string *)__return_storage_ptr__,(string *)local_a8);
                p_Var7 = local_48;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._0_8_ != &local_98) {
                  operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1)
                                 );
                }
                if (p_Var7 != (_Base_ptr)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7);
                }
                __mutex = local_38;
                if (p_Var9 != (_Base_ptr)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9);
                  __mutex = local_38;
                }
                goto LAB_0023e64a;
              }
            }
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.initialized_ == false) {
              local_68[0] = (_Base_ptr)local_58;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_68,"miniros.unknown_package","");
              plVar6 = (long *)::std::__cxx11::string::append((char *)local_68);
              p_Var7 = (_Base_ptr)(plVar6 + 2);
              if ((_Base_ptr)*plVar6 == p_Var7) {
                local_78._0_8_ = *(undefined8 *)p_Var7;
                local_78._8_8_ = plVar6[3];
                local_88._M_allocated_capacity = (size_type)(_Base_ptr)local_78;
              }
              else {
                local_78._0_8_ = *(undefined8 *)p_Var7;
                local_88._M_allocated_capacity = (size_type)(_Base_ptr)*plVar6;
              }
              local_88._8_8_ = plVar6[1];
              *plVar6 = (long)p_Var7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)::std::__cxx11::string::append(local_88._M_local_buf);
              paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 == paVar8) {
                local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_98._8_8_ = plVar6[3];
                local_a8._0_8_ = &local_98;
              }
              else {
                local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_a8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar6;
              }
              local_a8._8_8_ = plVar6[1];
              *plVar6 = (long)paVar8;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              console::initializeLogLocation
                        (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                          ::loc,(string *)local_a8,Warn);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._0_8_ != &local_98) {
                operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
              }
              if ((_Base_ptr)local_88._M_allocated_capacity != (_Base_ptr)local_78) {
                operator_delete((void *)local_88._M_allocated_capacity,local_78._0_8_ + 1);
              }
              if (local_68[0] != (_Base_ptr)local_58) {
                operator_delete(local_68[0],(ulong)((long)&local_58[0]->_M_color + 1));
              }
            }
            if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.level_ != Warn) {
              console::setLogLocationLevel
                        (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                          ::loc,Warn);
              console::checkLogLocationEnabled
                        (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                          ::loc);
            }
            if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,
                             resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                             ::loc.logger_,
                             resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                             ::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                             ,0xde,
                             "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                             ,"resolveAddressFor(%s) - no adapter matched for %s",
                             *(undefined8 *)(*(long *)local_40 + 0xc0),
                             (((requester->
                               super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->m_id)._M_dataplus._M_p);
            }
          }
          else {
            for (p_Var5 = *(_Rb_tree_node_base **)(paVar8->_M_local_buf + 0x38);
                p_Var5 != (_Rb_tree_node_base *)(paVar8->_M_local_buf + 0x28);
                p_Var5 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var5)) {
              bVar10 = network::NetAddress::isLocal((NetAddress *)(p_Var5 + 1));
              if (!bVar10) {
                network::NetAddress::str_abi_cxx11_((string *)local_a8,(NetAddress *)(p_Var5 + 1));
                goto LAB_0023e684;
              }
            }
            if (console::g_initialized == '\0') {
              console::initialize();
            }
            if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.initialized_ == false) {
              local_68[0] = (_Base_ptr)local_58;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_68,"miniros.unknown_package","");
              plVar6 = (long *)::std::__cxx11::string::append((char *)local_68);
              p_Var7 = (_Base_ptr)(plVar6 + 2);
              if ((_Base_ptr)*plVar6 == p_Var7) {
                local_78._0_8_ = *(undefined8 *)p_Var7;
                local_78._8_8_ = plVar6[3];
                local_88._M_allocated_capacity = (size_type)(_Base_ptr)local_78;
              }
              else {
                local_78._0_8_ = *(undefined8 *)p_Var7;
                local_88._M_allocated_capacity = (size_type)(_Base_ptr)*plVar6;
              }
              local_88._8_8_ = plVar6[1];
              *plVar6 = (long)p_Var7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              plVar6 = (long *)::std::__cxx11::string::append(local_88._M_local_buf);
              paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 == paVar8) {
                local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_98._8_8_ = plVar6[3];
                local_a8._0_8_ = &local_98;
              }
              else {
                local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
                local_a8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar6;
              }
              local_a8._8_8_ = plVar6[1];
              *plVar6 = (long)paVar8;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              console::initializeLogLocation
                        (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                          ::loc,(string *)local_a8,Warn);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._0_8_ != &local_98) {
                operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
              }
              if ((_Base_ptr)local_88._M_allocated_capacity != (_Base_ptr)local_78) {
                operator_delete((void *)local_88._M_allocated_capacity,local_78._0_8_ + 1);
              }
              if (local_68[0] != (_Base_ptr)local_58) {
                operator_delete(local_68[0],(ulong)((long)&local_58[0]->_M_color + 1));
              }
            }
            if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.level_ != Warn) {
              console::setLogLocationLevel
                        (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                          ::loc,Warn);
              console::checkLogLocationEnabled
                        (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                          ::loc);
            }
            if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc.logger_enabled_ == true) {
              console::print((FilterBase *)0x0,
                             resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                             ::loc.logger_,
                             resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                             ::loc.level_,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                             ,0xe7,
                             "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                             ,"resolveAddressFor(%s) - no suitable host address found for node %s",
                             *(undefined8 *)(*(long *)local_40 + 0xc0),
                             (((requester->
                               super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->m_id)._M_dataplus._M_p);
            }
          }
          if (console::g_initialized == '\0') {
            console::initialize();
          }
          if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
              ::loc.initialized_ == false) {
            local_68[0] = (_Base_ptr)local_58;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_68,"miniros.unknown_package","");
            plVar6 = (long *)::std::__cxx11::string::append((char *)local_68);
            p_Var7 = (_Base_ptr)(plVar6 + 2);
            if ((_Base_ptr)*plVar6 == p_Var7) {
              local_78._0_8_ = *(undefined8 *)p_Var7;
              local_78._8_8_ = plVar6[3];
              local_88._M_allocated_capacity = (size_type)(_Base_ptr)local_78;
            }
            else {
              local_78._0_8_ = *(undefined8 *)p_Var7;
              local_88._M_allocated_capacity = (size_type)(_Base_ptr)*plVar6;
            }
            local_88._8_8_ = plVar6[1];
            *plVar6 = (long)p_Var7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            plVar6 = (long *)::std::__cxx11::string::append(local_88._M_local_buf);
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar6 == paVar8) {
              local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_98._8_8_ = plVar6[3];
              local_a8._0_8_ = &local_98;
            }
            else {
              local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_a8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar6;
            }
            local_a8._8_8_ = plVar6[1];
            *plVar6 = (long)paVar8;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            console::initializeLogLocation
                      (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                        ::loc,(string *)local_a8,Warn);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._0_8_ != &local_98) {
              operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
            }
            if ((_Base_ptr)local_88._M_allocated_capacity != (_Base_ptr)local_78) {
              operator_delete((void *)local_88._M_allocated_capacity,local_78._0_8_ + 1);
            }
            if (local_68[0] != (_Base_ptr)local_58) {
              operator_delete(local_68[0],(ulong)((long)&local_58[0]->_M_color + 1));
            }
          }
          if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
              ::loc.level_ != Warn) {
            console::setLogLocationLevel
                      (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                        ::loc,Warn);
            console::checkLogLocationEnabled
                      (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                        ::loc);
          }
          if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
              ::loc.logger_enabled_ == true) {
            console::print((FilterBase *)0x0,
                           resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                           ::loc.logger_,
                           resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                           ::loc.level_,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                           ,0xea,
                           "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                           ,"resolveAddressFor(%s) - failed to resolve address for %s",
                           *(undefined8 *)(*(long *)local_40 + 0xc0),
                           (((requester->
                             super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr)->m_id)._M_dataplus._M_p);
          }
        }
      }
      if (local_48 != (_Base_ptr)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
      }
      __mutex = local_38;
      if (p_Var9 != (_Base_ptr)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9);
        __mutex = local_38;
      }
      goto LAB_0023e64a;
    }
  }
  if (console::g_initialized == '\0') {
    console::initialize();
  }
  if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
      ::loc.initialized_ == false) {
    local_68[0] = (_Base_ptr)local_58;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"miniros.unknown_package","");
    plVar6 = (long *)::std::__cxx11::string::append((char *)local_68);
    p_Var7 = (_Base_ptr)(plVar6 + 2);
    if ((_Base_ptr)*plVar6 == p_Var7) {
      local_78._0_8_ = *(undefined8 *)p_Var7;
      local_78._8_8_ = plVar6[3];
      local_88._M_allocated_capacity = (size_type)(_Base_ptr)local_78;
    }
    else {
      local_78._0_8_ = *(undefined8 *)p_Var7;
      local_88._M_allocated_capacity = (size_type)(_Base_ptr)*plVar6;
    }
    local_88._8_8_ = plVar6[1];
    *plVar6 = (long)p_Var7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::append(local_88._M_local_buf);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar8) {
      local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_98._8_8_ = plVar6[3];
      local_a8._0_8_ = &local_98;
    }
    else {
      local_98._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_a8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar6;
    }
    local_a8._8_8_ = plVar6[1];
    *plVar6 = (long)paVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    console::initializeLogLocation
              (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc,(string *)local_a8,Warn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._0_8_ != &local_98) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if ((_Base_ptr)local_88._M_allocated_capacity != (_Base_ptr)local_78) {
      operator_delete((void *)local_88._M_allocated_capacity,local_78._0_8_ + 1);
    }
    if (local_68[0] != (_Base_ptr)local_58) {
      operator_delete(local_68[0],(ulong)((long)&local_58[0]->_M_color + 1));
    }
  }
  if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
      ::loc.level_ != Warn) {
    console::setLogLocationLevel
              (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc,Warn);
    console::checkLogLocationEnabled
              (&resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                ::loc);
  }
  if (resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
      ::loc.logger_enabled_ == true) {
    console::print((FilterBase *)0x0,
                   resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                   ::loc.logger_,
                   resolveAddressFor(std::shared_ptr<miniros::master::NodeRef>const&,std::shared_ptr<miniros::master::NodeRef>const&)
                   ::loc.level_,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                   ,200,
                   "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const std::shared_ptr<NodeRef> &) const"
                   ,"resolveAddressFor(%s) - no HostInfo",*(undefined8 *)(*(long *)node + 0xc0));
  }
  __mutex = local_38;
  if (p_Var9 != (_Base_ptr)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9);
    __mutex = local_38;
  }
LAB_0023e64a:
  pthread_mutex_unlock(__mutex);
  return __return_storage_ptr__;
}

Assistant:

network::URL AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef>& node, const std::shared_ptr<NodeRef>& requester) const
{
  assert(node);
  if (!node)
    return {};
  network::URL url = node->getUrl();

  assert(requester);
  if (!requester) {
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - requester is null", node->id().c_str());
    return url;
  }

  std::scoped_lock lock(m_mutex);
  if (!m_resolveIp)
    return url;

  auto nodeHost = node->hostInfo().lock();
  if (!nodeHost) {
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - no HostInfo", node->id().c_str());
    return url;
  }

  auto requesterHost = requester->hostInfo().lock();
  if (!requesterHost) {
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - no HostInfo for requester %s", node->id().c_str(), requester->id().c_str());
    return url;
  }

  if (requesterHost && nodeHost == requesterHost) {
    // Both requester and node are on the same host. No additional resolution is needed.
    return url;
  }

  if (nodeHost->local) {
    for (const auto& adapter: m_adapters) {
      if (adapter.hasAccessTo(*requesterHost)) {
        url.host = adapter.address.str();
        return url;
      }
    }
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - no adapter matched for %s", node->id().c_str(), requester->id().c_str());
  } else {
    // Just return any address. That will fork for simple networks.
    for (const auto& addr: nodeHost->addresses) {
      if (!addr.isLocal()) {
        url.host = addr.str();
        return url;
      }
    }
    MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - no suitable host address found for node %s", node->id().c_str(), requester->id().c_str());
  }

  MINIROS_WARN_NAMED("resolver", "resolveAddressFor(%s) - failed to resolve address for %s", node->id().c_str(), requester->id().c_str());
  return url;
}